

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btConvexTriangleCallback::setTimeStepAndCounters
          (btConvexTriangleCallback *this,btScalar collisionMarginTriangle,
          btDispatcherInfo *dispatchInfo,btCollisionObjectWrapper *convexBodyWrap,
          btCollisionObjectWrapper *triBodyWrap,btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  btTransform *pbVar6;
  btCollisionShape *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 local_90;
  float local_88;
  undefined4 local_84;
  undefined8 local_80;
  float local_78;
  undefined4 local_74;
  undefined8 local_70;
  float local_68;
  undefined4 local_64;
  undefined1 local_60 [16];
  float local_50;
  float local_4c;
  float local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  undefined8 local_20;
  float local_18;
  
  this->m_convexBodyWrap = convexBodyWrap;
  this->m_triBodyWrap = triBodyWrap;
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle;
  this->m_resultOut = resultOut;
  btTransform::inverse(triBodyWrap->m_worldTransform);
  pbVar6 = this->m_convexBodyWrap->m_worldTransform;
  fVar1 = (pbVar6->m_basis).m_el[0].m_floats[2];
  fVar2 = (pbVar6->m_basis).m_el[1].m_floats[2];
  fVar3 = (pbVar6->m_basis).m_el[2].m_floats[2];
  local_88 = fVar3 * local_48 + fVar1 * local_50 + local_4c * fVar2;
  local_78 = fVar3 * local_38 + fVar1 * local_40 + fVar2 * local_3c;
  local_68 = fVar3 * local_28 + fVar1 * local_30 + fVar2 * local_2c;
  fVar1 = (pbVar6->m_origin).m_floats[0];
  fVar2 = (pbVar6->m_origin).m_floats[1];
  fVar3 = (pbVar6->m_origin).m_floats[2];
  uVar4 = *(undefined8 *)(pbVar6->m_basis).m_el[0].m_floats;
  uVar5 = *(undefined8 *)(pbVar6->m_basis).m_el[1].m_floats;
  fVar12 = (float)uVar5;
  fVar13 = (float)((ulong)uVar5 >> 0x20);
  fVar10 = (float)uVar4;
  fVar11 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(pbVar6->m_basis).m_el[2].m_floats;
  fVar8 = (float)uVar4;
  fVar9 = (float)((ulong)uVar4 >> 0x20);
  local_90 = CONCAT44(local_48 * fVar9 + local_50 * fVar11 + local_4c * fVar13,
                      local_48 * fVar8 + local_50 * fVar10 + local_4c * fVar12);
  local_84 = 0;
  local_80 = CONCAT44(local_38 * fVar9 + local_40 * fVar11 + local_3c * fVar13,
                      local_38 * fVar8 + local_40 * fVar10 + local_3c * fVar12);
  local_74 = 0;
  local_70 = CONCAT44(local_28 * fVar9 + local_30 * fVar11 + local_2c * fVar13,
                      local_28 * fVar8 + local_30 * fVar10 + local_2c * fVar12);
  local_64 = 0;
  local_60._4_4_ =
       (float)((ulong)local_20 >> 0x20) + local_38 * fVar3 + local_40 * fVar1 + fVar2 * local_3c;
  local_60._0_4_ = (float)local_20 + local_48 * fVar3 + local_50 * fVar1 + fVar2 * local_4c;
  local_60._8_4_ = fVar3 * local_28 + fVar1 * local_30 + local_2c * fVar2 + local_18;
  local_60._12_4_ = 0;
  pbVar7 = this->m_convexBodyWrap->m_shape;
  (*pbVar7->_vptr_btCollisionShape[2])(pbVar7,&local_90,&this->m_aabbMin,&this->m_aabbMax);
  uVar4 = *(undefined8 *)(this->m_aabbMax).m_floats;
  *(ulong *)(this->m_aabbMax).m_floats =
       CONCAT44((float)((ulong)uVar4 >> 0x20) + collisionMarginTriangle,
                (float)uVar4 + collisionMarginTriangle);
  (this->m_aabbMax).m_floats[2] = (this->m_aabbMax).m_floats[2] + collisionMarginTriangle;
  uVar4 = *(undefined8 *)(this->m_aabbMin).m_floats;
  *(ulong *)(this->m_aabbMin).m_floats =
       CONCAT44((float)((ulong)uVar4 >> 0x20) - collisionMarginTriangle,
                (float)uVar4 - collisionMarginTriangle);
  (this->m_aabbMin).m_floats[2] = (this->m_aabbMin).m_floats[2] - collisionMarginTriangle;
  return;
}

Assistant:

void	btConvexTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btDispatcherInfo& dispatchInfo,const btCollisionObjectWrapper* convexBodyWrap, const btCollisionObjectWrapper* triBodyWrap, btManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	btTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const btCollisionShape* convexShape = static_cast<const btCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<btCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace,m_aabbMin,m_aabbMax);
	btScalar extraMargin = collisionMarginTriangle;
	btVector3 extra(extraMargin,extraMargin,extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
	
}